

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::LogParser::StartElement(LogParser *this,string *name,char **atts)

{
  bool bVar1;
  char *pcVar2;
  char *rev;
  char **local_20;
  char **atts_local;
  string *name_local;
  LogParser *this_local;
  
  local_20 = atts;
  atts_local = (char **)name;
  name_local = (string *)this;
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          atts_local,"logentry");
  if (bVar1) {
    memset(&rev,0,0x100);
    cmCTestVC::Revision::Revision((Revision *)&rev);
    cmCTestVC::Revision::operator=(&this->Rev,(Revision *)&rev);
    cmCTestVC::Revision::~Revision((Revision *)&rev);
    pcVar2 = cmXMLParser::FindAttribute(local_20,"revision");
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Rev,pcVar2);
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::clear
              (&this->Changes);
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name, const char** atts)
    {
    this->CData.clear();
    if(name == "logentry")
      {
      this->Rev = Revision();
      if(const char* rev = this->FindAttribute(atts, "revision"))
        {
        this->Rev.Rev = rev;
        }
      this->Changes.clear();
      }
    }